

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O2

void AbortMission(void)

{
  int iVar1;
  
  bWaiting = 0;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  if (bMissionRunning != 0) {
    bMissionRunning = 0;
    puts("Mission stopped.");
    StopChronoQuick(&chrono_mission);
    if (logmissionfile != (FILE *)0x0) {
      iVar1 = fclose((FILE *)logmissionfile);
      if (iVar1 != 0) {
        puts("Error closing log file.");
      }
    }
    iVar1 = fclose((FILE *)missionfile);
    if (iVar1 != 0) {
      puts("Error closing mission file.");
    }
    missionfile = (FILE *)0x0;
    procstack = 0;
    memset(procstackids,0,0x400);
    memset(procreturnaddrs,0,0x400);
    memset(procdefineaddrs,0,0x400);
    memset(labels,0,0x1000);
    if (bMissionPaused == 0) {
      bMissionAtStartup = 0;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  DisableAllControls();
  return;
}

Assistant:

inline void AbortMission(void)
{
	bWaiting = FALSE;
	EnterCriticalSection(&MissionFilesCS);
	if (bMissionRunning)
	{
		bMissionRunning = FALSE;
		printf("Mission stopped.\n");
		StopChronoQuick(&chrono_mission);
		if ((logmissionfile != NULL)&&(fclose(logmissionfile) != EXIT_SUCCESS))
		{
			printf("Error closing log file.\n");
		}
		if (fclose(missionfile) != EXIT_SUCCESS) 
		{
			printf("Error closing mission file.\n");
		}
		missionfile = NULL;
		procstack = 0;
		memset(procstackids, 0, sizeof(procstackids));
		memset(procreturnaddrs, 0, sizeof(procreturnaddrs));
		memset(procdefineaddrs, 0, sizeof(procdefineaddrs));
		memset(labels, 0, sizeof(labels));
		if (!bMissionPaused) bMissionAtStartup = FALSE; // To indicate that potential next missions were not launched at startup...
	}
	LeaveCriticalSection(&MissionFilesCS);
	DisableAllControls();
}